

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void __thiscall
MutableS2ShapeIndex::AddFaceEdge
          (MutableS2ShapeIndex *this,FaceEdge *edge,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges)

{
  Edge *p;
  S2Point *p_00;
  bool bVar1;
  int face_00;
  int iVar2;
  int face;
  long lVar3;
  double dVar4;
  
  p = &edge->edge;
  face_00 = S2::GetFace(&p->v0);
  p_00 = &(edge->edge).v1;
  iVar2 = S2::GetFace(p_00);
  if (face_00 == iVar2) {
    S2::ValidFaceXYZtoUV(face_00,&p->v0,&edge->a);
    S2::ValidFaceXYZtoUV(face_00,p_00,&edge->b);
    dVar4 = 1.0 - kCellPadding;
    if ((((ABS((edge->a).c_[0]) <= dVar4) && (ABS((edge->a).c_[1]) <= dVar4)) &&
        (ABS((edge->b).c_[0]) <= dVar4)) && (ABS((edge->b).c_[1]) <= dVar4)) {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      push_back(all_edges + face_00,edge);
      return;
    }
  }
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    bVar1 = S2::ClipToPaddedFace(&p->v0,p_00,(int)lVar3,kCellPadding,&edge->a,&edge->b);
    if (bVar1) {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      push_back(all_edges,edge);
    }
    all_edges = all_edges + 1;
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::AddFaceEdge(
    FaceEdge* edge, vector<FaceEdge> all_edges[6]) const {
  // Fast path: both endpoints are on the same face, and are far enough from
  // the edge of the face that don't intersect any (padded) adjacent face.
  int a_face = S2::GetFace(edge->edge.v0);
  if (a_face == S2::GetFace(edge->edge.v1)) {
    S2::ValidFaceXYZtoUV(a_face, edge->edge.v0, &edge->a);
    S2::ValidFaceXYZtoUV(a_face, edge->edge.v1, &edge->b);
    const double kMaxUV = 1 - kCellPadding;
    if (fabs(edge->a[0]) <= kMaxUV && fabs(edge->a[1]) <= kMaxUV &&
        fabs(edge->b[0]) <= kMaxUV && fabs(edge->b[1]) <= kMaxUV) {
      all_edges[a_face].push_back(*edge);
      return;
    }
  }
  // Otherwise we simply clip the edge to all six faces.
  for (int face = 0; face < 6; ++face) {
    if (S2::ClipToPaddedFace(edge->edge.v0, edge->edge.v1, face,
                             kCellPadding, &edge->a, &edge->b)) {
      all_edges[face].push_back(*edge);
    }
  }
}